

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::QueryObjectResetCase::passAndLog
          (QueryObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  GLuint GVar1;
  char *description;
  TestContext *this_00;
  bool bVar2;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  GLuint queryReady;
  ostringstream local_198 [376];
  
  _queryReady = (TestLog *)((ulong)_queryReady & 0xffffffff00000000);
  (*contextReset->m_ptr->m_gl->getQueryObjectuiv)(contextReset->m_ptr->m_queryID,0x8867,&queryReady)
  ;
  GVar1 = queryReady;
  bVar2 = queryReady != 1;
  if (bVar2) {
    _queryReady = ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.
                   super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,"Test failed! glGetQueryObjectuiv() returned wrong value ["
                   );
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = GVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)local_198);
    std::operator<<((ostream *)local_198,", expected ");
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = 1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)local_198);
    std::operator<<((ostream *)local_198,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&queryReady,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    this_00 = (this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Fail";
  }
  else {
    this_00 = (this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_00,(uint)bVar2,description);
  return;
}

Assistant:

const char* eglResetNotificationStrategyToString (EGLint strategy)
{
	switch (strategy)
	{
		case EGL_NO_RESET_NOTIFICATION_KHR:		return "EGL_NO_RESET_NOTIFICATION_KHR";
		case EGL_LOSE_CONTEXT_ON_RESET_KHR:		return "EGL_LOSE_CONTEXT_ON_RESET_KHR";
		default:
			return "<Unknown>";
	}
}